

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerReflection::execution_model_to_str_abi_cxx11_
          (string *__return_storage_ptr__,CompilerReflection *this,ExecutionModel model)

{
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  int local_14;
  string *psStack_10;
  ExecutionModel model_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"vert",&local_15);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == 1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"tesc",local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (local_14 == 2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"tese",&local_26);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (local_14 == 3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"geom",&local_27);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else if (local_14 == 4) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"frag",&local_28);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  else if (local_14 == 5) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"comp",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else if (local_14 == 0x14c1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"rgen",&local_2a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  }
  else if (local_14 == 0x14c2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"rint",&local_2b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  }
  else if (local_14 == 0x14c3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"rahit",&local_2c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  }
  else if (local_14 == 0x14c4) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"rchit",&local_2d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  }
  else if (local_14 == 0x14c5) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"rmiss",&local_2e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else if (local_14 == 0x14c6) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"rcall",&local_2f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"???",&local_30);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerReflection::execution_model_to_str(spv::ExecutionModel model)
{
	switch (model)
	{
	case ExecutionModelVertex:
		return "vert";
	case ExecutionModelTessellationControl:
		return "tesc";
	case ExecutionModelTessellationEvaluation:
		return "tese";
	case ExecutionModelGeometry:
		return "geom";
	case ExecutionModelFragment:
		return "frag";
	case ExecutionModelGLCompute:
		return "comp";
	case ExecutionModelRayGenerationNV:
		return "rgen";
	case ExecutionModelIntersectionNV:
		return "rint";
	case ExecutionModelAnyHitNV:
		return "rahit";
	case ExecutionModelClosestHitNV:
		return "rchit";
	case ExecutionModelMissNV:
		return "rmiss";
	case ExecutionModelCallableNV:
		return "rcall";
	default:
		return "???";
	}
}